

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void qt_qFindChildren_helper
               (QObject *parent,QAnyStringView name,QMetaObject *mo,QList<void_*> *list,
               FindChildOptions options)

{
  QObjectData *pQVar1;
  long lVar2;
  QObject **ppQVar3;
  QObject *obj;
  bool bVar4;
  QObject *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (parent->d_ptr).d;
  lVar2 = (pQVar1->children).d.size;
  if (lVar2 != 0) {
    ppQVar3 = (pQVar1->children).d.ptr;
    lVar6 = 0;
    do {
      obj = *(QObject **)((long)ppQVar3 + lVar6);
      pQVar5 = QMetaObject::cast(mo,obj);
      if (pQVar5 != (QObject *)0x0) {
        if (name.field_0.m_data != (void *)0x0) {
          bVar4 = matches_objectName_non_null(obj,name);
          if (!bVar4) goto LAB_002b5bee;
        }
        local_40 = obj;
        QtPrivate::QPodArrayOps<void*>::emplace<void*&>
                  ((QPodArrayOps<void*> *)list,(list->d).size,&local_40);
        QList<void_*>::end(list);
      }
LAB_002b5bee:
      if (((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                 super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
        qt_qFindChildren_helper(obj,name,mo,list,options);
      }
      lVar6 = lVar6 + 8;
    } while (lVar2 << 3 != lVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_qFindChildren_helper(const QObject *parent, QAnyStringView name,
                             const QMetaObject &mo, QList<void*> *list, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    Q_ASSERT(list);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
            list->append(obj);
        if (options & Qt::FindChildrenRecursively)
            qt_qFindChildren_helper(obj, name, mo, list, options);
    }
}